

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encodeframe_utils.c
# Opt level: O2

void av1_get_tpl_stats_sb
               (AV1_COMP *cpi,BLOCK_SIZE bsize,int mi_row,int mi_col,SuperBlockEnc *sb_enc)

{
  int iVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  uint8_t uVar5;
  int stride;
  AV1_PRIMARY *pAVar6;
  TplDepFrame *pTVar7;
  TplDepStats *pTVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  int_mv *piVar12;
  int i;
  int iVar13;
  int iVar14;
  int iVar15;
  long lVar16;
  int iVar17;
  int iVar18;
  int_mv (*paiVar19) [7];
  long lVar20;
  uint uVar21;
  int mi_col_00;
  long lStack_80;
  
  sb_enc->tpl_data_count = 0;
  if ((cpi->oxcf).algo_cfg.enable_tpl_model != true) {
    return;
  }
  if ((cpi->common).current_frame.frame_type == '\0') {
    return;
  }
  pAVar6 = cpi->ppi;
  bVar2 = cpi->gf_frame_index;
  if (((pAVar6->gf_group).update_type[bVar2] & 0xfe) == 4) {
    return;
  }
  iVar13 = av1_tpl_stats_ready(&pAVar6->tpl_data,(uint)bVar2);
  if (iVar13 == 0) {
    return;
  }
  bVar3 = "\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"[bsize];
  pTVar7 = (pAVar6->tpl_data).tpl_frame;
  bVar4 = (cpi->common).superres_scale_denominator;
  iVar14 = (int)((uint)bVar4 * mi_col + 4) / 8;
  iVar17 = (int)(((uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                        [bsize] + mi_col) * (uint)bVar4 + 4) / 8;
  iVar13 = (cpi->common).superres_upscaled_width;
  uVar5 = (pAVar6->tpl_data).tpl_bsize_1d;
  if (uVar5 == '\x04') {
    lStack_80 = 0;
  }
  else if (uVar5 == '\b') {
    lStack_80 = 3;
  }
  else {
    if (uVar5 != '\x10') {
      if (uVar5 == '@') {
        lStack_80 = 0xc;
        goto LAB_0019141e;
      }
      if (uVar5 == ' ') {
        lStack_80 = 9;
        goto LAB_0019141e;
      }
    }
    lStack_80 = 6;
  }
LAB_0019141e:
  pTVar8 = pTVar7[bVar2].tpl_stats_ptr;
  stride = pTVar7[bVar2].stride;
  bVar2 = "\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"[lStack_80];
  uVar21 = (uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                 [lStack_80] * (uint)bVar4 + 4 >> 3;
  sb_enc->tpl_stride = (iVar17 - iVar14) / (int)uVar21;
  iVar1 = (uint)bVar3 + mi_row;
  lVar20 = 0;
  iVar18 = 0;
  for (; mi_row < iVar1; mi_row = mi_row + (uint)bVar2) {
    lVar20 = (long)(int)lVar20;
    paiVar19 = sb_enc->tpl_mv + lVar20;
    for (mi_col_00 = iVar14; mi_col_00 < iVar17; mi_col_00 = mi_col_00 + uVar21) {
      if ((mi_row < (cpi->common).mi_params.mi_rows) &&
         (mi_col_00 < (int)(iVar13 + 7 >> 2 & 0xfffffffeU))) {
        iVar15 = av1_tpl_ptr_pos(mi_row,mi_col_00,stride,(pAVar6->tpl_data).tpl_stats_block_mis_log2
                                );
        sb_enc->tpl_inter_cost[lVar20] = (long)(pTVar8[iVar15].inter_cost << 4);
        sb_enc->tpl_intra_cost[lVar20] = (long)(pTVar8[iVar15].intra_cost << 4);
        uVar9 = *(undefined8 *)pTVar8[iVar15].mv;
        uVar10 = *(undefined8 *)(pTVar8[iVar15].mv + 2);
        uVar11 = *(undefined8 *)(pTVar8[iVar15].mv + 3 + 2);
        piVar12 = sb_enc->tpl_mv[lVar20];
        *(undefined8 *)(piVar12 + 3) = *(undefined8 *)(pTVar8[iVar15].mv + 3);
        *(undefined8 *)(piVar12 + 5) = uVar11;
        *(undefined8 *)sb_enc->tpl_mv[lVar20] = uVar9;
        *(undefined8 *)(sb_enc->tpl_mv[lVar20] + 2) = uVar10;
        iVar18 = iVar18 + 1;
      }
      else {
        sb_enc->tpl_inter_cost[lVar20] = 0x7fffffffffffffff;
        sb_enc->tpl_intra_cost[lVar20] = 0x7fffffffffffffff;
        for (lVar16 = 0; lVar16 != 7; lVar16 = lVar16 + 1) {
          (*paiVar19)[lVar16].as_int = 0x80008000;
        }
      }
      lVar20 = lVar20 + 1;
      paiVar19 = paiVar19 + 1;
    }
  }
  sb_enc->tpl_data_count = iVar18;
  return;
}

Assistant:

void av1_get_tpl_stats_sb(AV1_COMP *cpi, BLOCK_SIZE bsize, int mi_row,
                          int mi_col, SuperBlockEnc *sb_enc) {
  sb_enc->tpl_data_count = 0;

  if (!cpi->oxcf.algo_cfg.enable_tpl_model) return;
  if (cpi->common.current_frame.frame_type == KEY_FRAME) return;
  const FRAME_UPDATE_TYPE update_type =
      get_frame_update_type(&cpi->ppi->gf_group, cpi->gf_frame_index);
  if (update_type == INTNL_OVERLAY_UPDATE || update_type == OVERLAY_UPDATE)
    return;
  assert(IMPLIES(cpi->ppi->gf_group.size > 0,
                 cpi->gf_frame_index < cpi->ppi->gf_group.size));

  AV1_COMMON *const cm = &cpi->common;
  const int gf_group_index = cpi->gf_frame_index;
  TplParams *const tpl_data = &cpi->ppi->tpl_data;
  if (!av1_tpl_stats_ready(tpl_data, gf_group_index)) return;
  const int mi_wide = mi_size_wide[bsize];
  const int mi_high = mi_size_high[bsize];

  TplDepFrame *tpl_frame = &tpl_data->tpl_frame[gf_group_index];
  TplDepStats *tpl_stats = tpl_frame->tpl_stats_ptr;
  int tpl_stride = tpl_frame->stride;

  int mi_count = 0;
  int count = 0;
  const int mi_col_sr =
      coded_to_superres_mi(mi_col, cm->superres_scale_denominator);
  const int mi_col_end_sr =
      coded_to_superres_mi(mi_col + mi_wide, cm->superres_scale_denominator);
  // mi_cols_sr is mi_cols at superres case.
  const int mi_cols_sr = av1_pixels_to_mi(cm->superres_upscaled_width);

  // TPL store unit size is not the same as the motion estimation unit size.
  // Here always use motion estimation size to avoid getting repetitive inter/
  // intra cost.
  const BLOCK_SIZE tpl_bsize = convert_length_to_bsize(tpl_data->tpl_bsize_1d);
  assert(mi_size_wide[tpl_bsize] == mi_size_high[tpl_bsize]);
  const int row_step = mi_size_high[tpl_bsize];
  const int col_step_sr = coded_to_superres_mi(mi_size_wide[tpl_bsize],
                                               cm->superres_scale_denominator);

  // Stride is only based on SB size, and we fill in values for every 16x16
  // block in a SB.
  sb_enc->tpl_stride = (mi_col_end_sr - mi_col_sr) / col_step_sr;

  for (int row = mi_row; row < mi_row + mi_high; row += row_step) {
    for (int col = mi_col_sr; col < mi_col_end_sr; col += col_step_sr) {
      assert(count < MAX_TPL_BLK_IN_SB * MAX_TPL_BLK_IN_SB);
      // Handle partial SB, so that no invalid values are used later.
      if (row >= cm->mi_params.mi_rows || col >= mi_cols_sr) {
        sb_enc->tpl_inter_cost[count] = INT64_MAX;
        sb_enc->tpl_intra_cost[count] = INT64_MAX;
        for (int i = 0; i < INTER_REFS_PER_FRAME; ++i) {
          sb_enc->tpl_mv[count][i].as_int = INVALID_MV;
        }
        count++;
        continue;
      }

      TplDepStats *this_stats = &tpl_stats[av1_tpl_ptr_pos(
          row, col, tpl_stride, tpl_data->tpl_stats_block_mis_log2)];
      sb_enc->tpl_inter_cost[count] = this_stats->inter_cost
                                      << TPL_DEP_COST_SCALE_LOG2;
      sb_enc->tpl_intra_cost[count] = this_stats->intra_cost
                                      << TPL_DEP_COST_SCALE_LOG2;
      memcpy(sb_enc->tpl_mv[count], this_stats->mv, sizeof(this_stats->mv));
      mi_count++;
      count++;
    }
  }

  assert(mi_count <= MAX_TPL_BLK_IN_SB * MAX_TPL_BLK_IN_SB);
  sb_enc->tpl_data_count = mi_count;
}